

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::NameResolver::VisitModule(NameResolver *this,Module *module)

{
  pointer ppFVar1;
  Func *func;
  pointer ppEVar2;
  pointer ppGVar3;
  pointer ppTVar4;
  ElemSegment *pEVar5;
  pointer piVar6;
  pointer ppDVar7;
  DataSegment *pDVar8;
  pointer ppVVar9;
  ulong uVar10;
  pointer ppEVar11;
  pointer ppFVar12;
  pointer ppEVar13;
  pointer ppGVar14;
  pointer ppTVar15;
  pointer ppDVar16;
  ExprList *elem_expr;
  pointer piVar17;
  pointer ppVVar18;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  ExprVisitor *local_40;
  pointer local_38;
  
  this->current_module_ = module;
  CheckDuplicateBindings(this,&module->elem_segment_bindings,"elem");
  CheckDuplicateBindings(this,&module->func_bindings,"function");
  CheckDuplicateBindings(this,&module->global_bindings,"global");
  CheckDuplicateBindings(this,&module->type_bindings,"type");
  CheckDuplicateBindings(this,&module->table_bindings,"table");
  CheckDuplicateBindings(this,&module->memory_bindings,"memory");
  CheckDuplicateBindings(this,&module->tag_bindings,"tag");
  ppFVar12 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppFVar12 != ppFVar1) {
    do {
      func = *ppFVar12;
      this->current_func_ = func;
      if ((func->decl).has_func_type == true) {
        ResolveVar(this,&this->current_module_->type_bindings,&(func->decl).type_var,"type");
      }
      pcStack_50 = std::
                   _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/resolve-names.cc:510:33)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/resolve-names.cc:510:33)>
                 ::_M_manager;
      local_68._M_unused._0_8_ = (undefined8)func;
      local_68._8_8_ = this;
      BindingHash::FindDuplicates(&func->bindings,(DuplicateCallback *)&local_68);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      ExprVisitor::VisitFunc(&this->visitor_,func);
      this->current_func_ = (Func *)0x0;
      ppFVar12 = ppFVar12 + 1;
    } while (ppFVar12 != ppFVar1);
  }
  ppEVar2 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar13 = (module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppEVar13 != ppEVar2; ppEVar13 = ppEVar13 + 1) {
    uVar10 = (ulong)(*ppEVar13)->kind;
    if (uVar10 < 5) {
      ResolveVar(this,(BindingHash *)
                      ((long)&(this->current_module_->loc).filename._M_len +
                      *(long *)(&DAT_00207e40 + uVar10 * 8)),&(*ppEVar13)->var,
                 &DAT_00207e68 + *(int *)(&DAT_00207e68 + uVar10 * 4));
    }
  }
  ppGVar14 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar3 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar14 != ppGVar3) {
    do {
      ExprVisitor::VisitExprList(&this->visitor_,&(*ppGVar14)->init_expr);
      ppGVar14 = ppGVar14 + 1;
    } while (ppGVar14 != ppGVar3);
  }
  ppTVar4 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar15 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppTVar15 != ppTVar4;
      ppTVar15 = ppTVar15 + 1) {
    if (((*ppTVar15)->decl).has_func_type == true) {
      ResolveVar(this,&this->current_module_->type_bindings,&((*ppTVar15)->decl).type_var,"type");
    }
  }
  ppEVar11 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_38 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppEVar11 != local_38) {
    local_40 = &this->visitor_;
    do {
      pEVar5 = *ppEVar11;
      ResolveVar(this,&this->current_module_->table_bindings,&pEVar5->table_var,"table");
      ExprVisitor::VisitExprList(local_40,&pEVar5->offset);
      piVar6 = (pEVar5->elem_exprs).
               super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (piVar17 = (pEVar5->elem_exprs).
                     super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; piVar17 != piVar6;
          piVar17 = piVar17 + 1) {
        if ((piVar17->size_ == 1) && (piVar17->first_->type_ == RefFunc)) {
          ResolveVar(this,&this->current_module_->func_bindings,(Var *)(piVar17->first_ + 1),
                     "function");
        }
      }
      ppEVar11 = ppEVar11 + 1;
    } while (ppEVar11 != local_38);
  }
  ppDVar16 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppDVar7 = (module->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppDVar16 != ppDVar7) {
    do {
      pDVar8 = *ppDVar16;
      ResolveVar(this,&this->current_module_->memory_bindings,&pDVar8->memory_var,"memory");
      ExprVisitor::VisitExprList(&this->visitor_,&pDVar8->offset);
      ppDVar16 = ppDVar16 + 1;
    } while (ppDVar16 != ppDVar7);
  }
  ppVVar9 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar18 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppVVar18 != ppVVar9;
      ppVVar18 = ppVVar18 + 1) {
    ResolveVar(this,&this->current_module_->func_bindings,*ppVVar18,"function");
  }
  this->current_module_ = (Module *)0x0;
  return (Result)(this->result_).enum_;
}

Assistant:

Result NameResolver::VisitModule(Module* module) {
  current_module_ = module;
  CheckDuplicateBindings(&module->elem_segment_bindings, "elem");
  CheckDuplicateBindings(&module->func_bindings, "function");
  CheckDuplicateBindings(&module->global_bindings, "global");
  CheckDuplicateBindings(&module->type_bindings, "type");
  CheckDuplicateBindings(&module->table_bindings, "table");
  CheckDuplicateBindings(&module->memory_bindings, "memory");
  CheckDuplicateBindings(&module->tag_bindings, "tag");

  for (Func* func : module->funcs)
    VisitFunc(func);
  for (Export* export_ : module->exports)
    VisitExport(export_);
  for (Global* global : module->globals)
    VisitGlobal(global);
  for (Tag* tag : module->tags)
    VisitTag(tag);
  for (ElemSegment* elem_segment : module->elem_segments)
    VisitElemSegment(elem_segment);
  for (DataSegment* data_segment : module->data_segments)
    VisitDataSegment(data_segment);
  for (Var* start : module->starts)
    ResolveFuncVar(start);
  current_module_ = nullptr;
  return result_;
}